

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O1

void __thiscall
TPZMatrix<Fad<long_double>_>::MultiplyByScalar
          (TPZMatrix<Fad<long_double>_> *this,Fad<long_double> *alpha,
          TPZMatrix<Fad<long_double>_> *res)

{
  uint uVar1;
  ulong uVar2;
  Fad<long_double> local_e8;
  TPZFMatrixRef<Fad<long_double>_> local_b0;
  
  (*(res->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x1f])(res,this);
  local_e8.val_ = alpha->val_;
  uVar1 = (alpha->dx_).num_elts;
  local_e8.dx_.ptr_to_data = (longdouble *)0x0;
  local_e8.dx_.num_elts = uVar1;
  if ((long)(int)uVar1 != 0) {
    uVar2 = 0xffffffffffffffff;
    if (-1 < (int)uVar1) {
      uVar2 = (long)(int)uVar1 << 4;
    }
    local_e8.dx_.ptr_to_data = (longdouble *)operator_new__(uVar2);
    MEM_CPY<long_double>::copy
              ((MEM_CPY<long_double> *)local_e8.dx_.ptr_to_data,
               (EVP_PKEY_CTX *)(alpha->dx_).ptr_to_data,(EVP_PKEY_CTX *)(ulong)uVar1);
  }
  local_e8.defaultVal = alpha->defaultVal;
  Storage(&local_b0,res);
  TPZFMatrix<Fad<long_double>_>::operator*=(&local_b0.super_TPZFMatrix<Fad<long_double>_>,&local_e8)
  ;
  TPZFMatrixRef<Fad<long_double>_>::~TPZFMatrixRef(&local_b0,&TPZFMatrixRef<Fad<long_double>>::VTT);
  Fad<long_double>::~Fad(&local_e8);
  return;
}

Assistant:

void TPZMatrix<TVar>::MultiplyByScalar(const TVar alpha, TPZMatrix<TVar>&res) const
{
  res.CopyFrom(this);
  res.Storage() *= alpha;
}